

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O3

void QtSharedPointer::internalSafetyCheckRemove(void *d_ptr)

{
  Entry *pEVar1;
  __pointer_type pQVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  Data *pDVar6;
  Span *pSVar7;
  Entry *pEVar8;
  Entry *pEVar9;
  undefined8 uVar10;
  uchar uVar11;
  Type *this;
  undefined8 extraout_RAX;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Span *pSVar15;
  Span *pSVar16;
  Span *pSVar17;
  ulong uVar18;
  Span *pSVar19;
  long in_FS_OFFSET;
  bool bVar20;
  Bucket BVar21;
  const_iterator it;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>::
         operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>
                     *)d_ptr);
  if (this == (Type *)0x0) {
LAB_003873da:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
      return;
    }
  }
  else {
    if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar20 = (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar20) {
        (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar20) goto LAB_00387110;
    }
    else {
LAB_00387110:
      QBasicMutex::lockInternal((QBasicMutex *)this);
    }
    pDVar6 = (this->dPointers).d;
    if ((pDVar6 != (Data *)0x0) && (pDVar6->size != 0)) {
      pSVar19 = pDVar6->spans;
      BVar21 = QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
               findBucketWithHash<void_const*>
                         ((Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)
                          pDVar6->numBuckets,(void **)pSVar19,(size_t)d_ptr);
      if ((BVar21.span)->offsets[BVar21.index] != 0xff) {
        uVar12 = (((ulong)((long)BVar21.span - (long)pSVar19) >> 4) * 0x1c71c71c71c71c80 |
                 BVar21.index) >> 7;
        uVar14 = (ulong)((uint)BVar21.index & 0x7f);
        it = QHash<void_const_volatile*,void_const*>::constFindImpl<void_const_volatile*>
                       ((QHash<void_const_volatile*,void_const*> *)&this->dataPointers,
                        (void **)(pSVar19[uVar12].entries[pSVar19[uVar12].offsets[uVar14]].storage.
                                  data + 8));
        QHash<const_volatile_void_*,_const_void_*>::erase(&this->dataPointers,it);
        QHash<const_void_*,_(anonymous_namespace)::Data>::detach(&this->dPointers);
        pDVar6 = (this->dPointers).d;
        pSVar7 = pDVar6->spans;
        pSVar19 = pSVar7 + uVar12;
        bVar3 = pSVar19->offsets[uVar14];
        pSVar19->offsets[uVar14] = 0xff;
        pSVar7[uVar12].entries[bVar3].storage.data[0] = pSVar7[uVar12].nextFree;
        pSVar7[uVar12].nextFree = bVar3;
        pDVar6->size = pDVar6->size - 1;
LAB_00387230:
        pSVar7 = pDVar6->spans;
        uVar13 = pDVar6->numBuckets >> 7;
        pSVar15 = pSVar19;
        uVar12 = uVar14;
        while( true ) {
          uVar12 = uVar12 + 1;
          if (uVar12 == 0x80) {
            pSVar15 = pSVar15 + 1;
            if (((long)pSVar15 - (long)pSVar7 >> 4) * -0x71c71c71c71c71c7 - uVar13 == 0) {
              pSVar15 = pSVar7;
            }
            uVar12 = 0;
          }
          if (pSVar15->offsets[uVar12] == 0xff) break;
          uVar18 = pDVar6->seed ^ *(ulong *)pSVar15->entries[pSVar15->offsets[uVar12]].storage.data;
          uVar18 = (uVar18 >> 0x20 ^ uVar18) * -0x2917014799a6026d;
          uVar18 = (uVar18 >> 0x20 ^ uVar18) * -0x2917014799a6026d;
          uVar18 = (uVar18 >> 0x20 ^ uVar18) & pDVar6->numBuckets - 1;
          pSVar16 = pSVar7 + (uVar18 >> 7);
          uVar18 = (ulong)((uint)uVar18 & 0x7f);
          while ((uVar18 != uVar12 || (pSVar16 != pSVar15))) {
            if ((pSVar16 == pSVar19) && (uVar18 == uVar14)) {
              if (pSVar15 == pSVar19) {
                pSVar19->offsets[uVar14] = pSVar19->offsets[uVar12];
                pSVar19->offsets[uVar12] = 0xff;
                uVar14 = uVar12;
                pSVar19 = pSVar15;
              }
              else {
                uVar11 = pSVar19->nextFree;
                if (uVar11 == pSVar19->allocated) {
                  QHashPrivate::Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>
                  ::addStorage(pSVar19);
                  uVar11 = pSVar19->nextFree;
                }
                pSVar19->offsets[uVar14] = uVar11;
                pEVar8 = pSVar19->entries;
                bVar3 = pSVar19->nextFree;
                pSVar19->nextFree = pEVar8[bVar3].storage.data[0];
                bVar4 = pSVar15->offsets[uVar12];
                pSVar15->offsets[uVar12] = 0xff;
                pEVar9 = pSVar15->entries;
                pEVar1 = pEVar9 + bVar4;
                uVar10 = *(undefined8 *)((pEVar1->storage).data + 8);
                pEVar8 = pEVar8 + bVar3;
                *(undefined8 *)(pEVar8->storage).data = *(undefined8 *)(pEVar1->storage).data;
                *(undefined8 *)((pEVar8->storage).data + 8) = uVar10;
                pEVar9[bVar4].storage.data[0] = pSVar15->nextFree;
                pSVar15->nextFree = bVar4;
                uVar14 = uVar12;
                pSVar19 = pSVar15;
              }
              goto LAB_00387230;
            }
            uVar18 = uVar18 + 1;
            if (uVar18 == 0x80) {
              pSVar17 = pSVar16 + 1;
              pSVar16 = pSVar7;
              if (((long)pSVar17 - (long)pSVar7 >> 4) * -0x71c71c71c71c71c7 - uVar13 != 0) {
                pSVar16 = pSVar17;
              }
              uVar18 = 0;
            }
          }
        }
        LOCK();
        pQVar2 = (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
        (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        if (pQVar2 != (__pointer_type)0x1) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
            QBasicMutex::unlockInternalFutex((QBasicMutex *)this,pQVar2);
            return;
          }
          goto LAB_00387470;
        }
        goto LAB_003873da;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
      internalSafetyCheckRemove();
      LOCK();
      pQVar2 = (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
      (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if (pQVar2 != (__pointer_type)0x1) {
        QBasicMutex::unlockInternalFutex((QBasicMutex *)this,pQVar2);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
        _Unwind_Resume(extraout_RAX);
      }
    }
  }
LAB_00387470:
  __stack_chk_fail();
}

Assistant:

void QtSharedPointer::internalSafetyCheckRemove(const void *d_ptr)
{
    KnownPointers *const kp = knownPointers();
    if (!kp)
        return;                 // end-game: the application is being destroyed already

    QMutexLocker lock(&kp->mutex);

    const auto it = kp->dPointers.constFind(d_ptr);
    if (Q_UNLIKELY(it == kp->dPointers.cend())) {
        qFatal("QSharedPointer: internal self-check inconsistency: pointer %p was not tracked. "
               "To use QT_SHAREDPOINTER_TRACK_POINTERS, you have to enable it throughout "
               "in your code.", d_ptr);
    }

    const auto it2 = kp->dataPointers.constFind(it->pointer);
    Q_ASSERT(it2 != kp->dataPointers.cend());

    //qDebug("Removing d=%p value=%p", d_ptr, it->pointer);

    // remove entries
    kp->dataPointers.erase(it2);
    kp->dPointers.erase(it);
    Q_ASSERT(kp->dPointers.size() == kp->dataPointers.size());
}